

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,TableArrayField *field,void *data)

{
  int table_register;
  Instruction i;
  Function *this_00;
  uint key_register;
  
  table_register = *data;
  this_00 = this->current_function_->function_;
  key_register = GenerateRegisterId(this);
  Function::AddInstruction
            (this_00,(Instruction)((key_register & 0xff) << 0x10 | 0x4000000),field->line_);
  i.opcode_ = *(uint *)((long)data + 4);
  *(uint *)((long)data + 4) = i.opcode_ + 1;
  Function::AddInstruction(this_00,i,field->line_);
  SetTableFieldValue<luna::TableArrayField>(this,field,table_register,key_register,field->line_);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(TableArrayField *field, void *data)
    {
        auto field_data = static_cast<TableFieldData *>(data);
        auto table_register = field_data->table_register_;

        // Load key
        auto function = GetCurrentFunction();
        auto key_register = GenerateRegisterId();
        auto instruction = Instruction::ACode(OpType_LoadInt, key_register);
        function->AddInstruction(instruction, field->line_);
        instruction.opcode_ = field_data->array_index_++;
        function->AddInstruction(instruction, field->line_);

        SetTableFieldValue(field, table_register, key_register, field->line_);
    }